

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.c++
# Opt level: O0

Orphan<capnp::List<capnp::schema::CodeGeneratorRequest::RequestedFile::Import,_(capnp::Kind)3>_> *
__thiscall
capnp::compiler::Compiler::getFileImportTable
          (Orphan<capnp::List<capnp::schema::CodeGeneratorRequest::RequestedFile::Import,_(capnp::Kind)3>_>
           *__return_storage_ptr__,Compiler *this,Module *module,Orphanage orphanage)

{
  Orphanage orphanage_00;
  Own<capnp::compiler::Compiler::Impl,_std::nullptr_t> *this_00;
  Impl *this_01;
  Maybe<kj::_::Mutex::Waiter_&> *local_30;
  Module *module_local;
  Compiler *this_local;
  Orphanage orphanage_local;
  
  orphanage_local.arena = (BuilderArena *)orphanage.capTable;
  this_local = (Compiler *)orphanage.arena;
  local_30 = (Maybe<kj::_::Mutex::Waiter_&> *)module;
  module_local = (Module *)this;
  orphanage_local.capTable = (CapTableBuilder *)__return_storage_ptr__;
  kj::MutexGuarded<kj::Own<capnp::compiler::Compiler::Impl,_std::nullptr_t>_>::lockExclusive
            ((MutexGuarded<kj::Own<capnp::compiler::Compiler::Impl,_std::nullptr_t>_> *)
             &stack0xffffffffffffffc0,&this->impl);
  this_00 = kj::Locked<kj::Own<capnp::compiler::Compiler::Impl,_std::nullptr_t>_>::operator->
                      ((Locked<kj::Own<capnp::compiler::Compiler::Impl,_std::nullptr_t>_> *)
                       &stack0xffffffffffffffc0);
  this_01 = kj::Own<capnp::compiler::Compiler::Impl,_std::nullptr_t>::get(this_00);
  orphanage_00.capTable = (CapTableBuilder *)orphanage_local.arena;
  orphanage_00.arena = (BuilderArena *)this_local;
  Impl::getFileImportTable(__return_storage_ptr__,this_01,(Module *)local_30,orphanage_00);
  kj::Locked<kj::Own<capnp::compiler::Compiler::Impl,_std::nullptr_t>_>::~Locked
            ((Locked<kj::Own<capnp::compiler::Compiler::Impl,_std::nullptr_t>_> *)
             &stack0xffffffffffffffc0);
  return __return_storage_ptr__;
}

Assistant:

Orphan<List<schema::CodeGeneratorRequest::RequestedFile::Import>>
    Compiler::getFileImportTable(Module& module, Orphanage orphanage) const {
  return impl.lockExclusive()->get()->getFileImportTable(module, orphanage);
}